

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseMaps.h
# Opt level: O2

void __thiscall
tonk::
LightHashMap<asio::ip::basic_endpoint<asio::ip::udp>,_tonk::IConnection_*,_tonk::UDPAddressHasher>::
rehash(LightHashMap<asio::ip::basic_endpoint<asio::ip::udp>,_tonk::IConnection_*,_tonk::UDPAddressHasher>
       *this,uint new_hash_size)

{
  uint uVar1;
  uint uVar2;
  raw_node *prVar3;
  ulong uVar4;
  ulong *puVar5;
  ulong *puVar6;
  ulong uVar7;
  long lVar8;
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  
  uVar1 = this->m_num_valid;
  if (uVar1 <= new_hash_size) {
    uVar2 = this->m_values_count;
    if (uVar2 != new_hash_size) {
      lVar8 = (ulong)new_hash_size * 0x30;
      prVar3 = this->m_values;
      puVar5 = (ulong *)operator_new__(lVar8 + 8);
      *puVar5 = (ulong)new_hash_size;
      if (new_hash_size != 0) {
        uVar7 = 0;
        auVar9 = vpmovsxbq_avx512f(ZEXT816(0x3f3e3d3c3b3a3938));
        auVar10 = vpmovsxbq_avx512f(ZEXT816(0x3736353433323130));
        auVar11 = vpmovsxbq_avx512f(ZEXT816(0x2f2e2d2c2b2a2928));
        auVar12 = vpmovsxbq_avx512f(ZEXT816(0x2726252423222120));
        auVar13 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
        auVar14 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
        auVar15 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar16 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar17 = vpbroadcastq_avx512f();
        puVar6 = puVar5;
        do {
          auVar18 = vpbroadcastq_avx512f();
          auVar19 = vporq_avx512f(auVar18,auVar16);
          uVar4 = vpcmpuq_avx512f(auVar19,auVar17,2);
          if ((uVar4 & 1) != 0) {
            *(undefined1 *)(puVar6 + 6) = 0;
          }
          if ((uVar4 & 2) != 0) {
            *(undefined1 *)(puVar6 + 0xc) = 0;
          }
          if ((uVar4 & 4) != 0) {
            *(undefined1 *)(puVar6 + 0x12) = 0;
          }
          if ((uVar4 & 8) != 0) {
            *(undefined1 *)(puVar6 + 0x18) = 0;
          }
          if ((uVar4 & 0x10) != 0) {
            *(undefined1 *)(puVar6 + 0x1e) = 0;
          }
          if ((uVar4 & 0x20) != 0) {
            *(undefined1 *)(puVar6 + 0x24) = 0;
          }
          if ((uVar4 & 0x40) != 0) {
            *(undefined1 *)(puVar6 + 0x2a) = 0;
          }
          if ((uVar4 & 0x80) != 0) {
            *(undefined1 *)(puVar6 + 0x30) = 0;
          }
          auVar19 = vporq_avx512f(auVar18,auVar15);
          uVar4 = vpcmpuq_avx512f(auVar19,auVar17,2);
          if ((uVar4 & 1) != 0) {
            *(undefined1 *)(puVar6 + 0x36) = 0;
          }
          if ((uVar4 & 2) != 0) {
            *(undefined1 *)(puVar6 + 0x3c) = 0;
          }
          if ((uVar4 & 4) != 0) {
            *(undefined1 *)(puVar6 + 0x42) = 0;
          }
          if ((uVar4 & 8) != 0) {
            *(undefined1 *)(puVar6 + 0x48) = 0;
          }
          if ((uVar4 & 0x10) != 0) {
            *(undefined1 *)(puVar6 + 0x4e) = 0;
          }
          if ((uVar4 & 0x20) != 0) {
            *(undefined1 *)(puVar6 + 0x54) = 0;
          }
          if ((uVar4 & 0x40) != 0) {
            *(undefined1 *)(puVar6 + 0x5a) = 0;
          }
          if ((uVar4 & 0x80) != 0) {
            *(undefined1 *)(puVar6 + 0x60) = 0;
          }
          auVar19 = vporq_avx512f(auVar18,auVar14);
          uVar4 = vpcmpuq_avx512f(auVar19,auVar17,2);
          if ((uVar4 & 1) != 0) {
            *(undefined1 *)(puVar6 + 0x66) = 0;
          }
          if ((uVar4 & 2) != 0) {
            *(undefined1 *)(puVar6 + 0x6c) = 0;
          }
          if ((uVar4 & 4) != 0) {
            *(undefined1 *)(puVar6 + 0x72) = 0;
          }
          if ((uVar4 & 8) != 0) {
            *(undefined1 *)(puVar6 + 0x78) = 0;
          }
          if ((uVar4 & 0x10) != 0) {
            *(undefined1 *)(puVar6 + 0x7e) = 0;
          }
          if ((uVar4 & 0x20) != 0) {
            *(undefined1 *)(puVar6 + 0x84) = 0;
          }
          if ((uVar4 & 0x40) != 0) {
            *(undefined1 *)(puVar6 + 0x8a) = 0;
          }
          if ((uVar4 & 0x80) != 0) {
            *(undefined1 *)(puVar6 + 0x90) = 0;
          }
          auVar19 = vporq_avx512f(auVar18,auVar13);
          uVar4 = vpcmpuq_avx512f(auVar19,auVar17,2);
          if ((uVar4 & 1) != 0) {
            *(undefined1 *)(puVar6 + 0x96) = 0;
          }
          if ((uVar4 & 2) != 0) {
            *(undefined1 *)(puVar6 + 0x9c) = 0;
          }
          if ((uVar4 & 4) != 0) {
            *(undefined1 *)(puVar6 + 0xa2) = 0;
          }
          if ((uVar4 & 8) != 0) {
            *(undefined1 *)(puVar6 + 0xa8) = 0;
          }
          if ((uVar4 & 0x10) != 0) {
            *(undefined1 *)(puVar6 + 0xae) = 0;
          }
          if ((uVar4 & 0x20) != 0) {
            *(undefined1 *)(puVar6 + 0xb4) = 0;
          }
          if ((uVar4 & 0x40) != 0) {
            *(undefined1 *)(puVar6 + 0xba) = 0;
          }
          if ((uVar4 & 0x80) != 0) {
            *(undefined1 *)(puVar6 + 0xc0) = 0;
          }
          auVar19 = vporq_avx512f(auVar18,auVar12);
          uVar4 = vpcmpuq_avx512f(auVar19,auVar17,2);
          if ((uVar4 & 1) != 0) {
            *(undefined1 *)(puVar6 + 0xc6) = 0;
          }
          if ((uVar4 & 2) != 0) {
            *(undefined1 *)(puVar6 + 0xcc) = 0;
          }
          if ((uVar4 & 4) != 0) {
            *(undefined1 *)(puVar6 + 0xd2) = 0;
          }
          if ((uVar4 & 8) != 0) {
            *(undefined1 *)(puVar6 + 0xd8) = 0;
          }
          if ((uVar4 & 0x10) != 0) {
            *(undefined1 *)(puVar6 + 0xde) = 0;
          }
          if ((uVar4 & 0x20) != 0) {
            *(undefined1 *)(puVar6 + 0xe4) = 0;
          }
          if ((uVar4 & 0x40) != 0) {
            *(undefined1 *)(puVar6 + 0xea) = 0;
          }
          if ((uVar4 & 0x80) != 0) {
            *(undefined1 *)(puVar6 + 0xf0) = 0;
          }
          auVar19 = vporq_avx512f(auVar18,auVar11);
          uVar4 = vpcmpuq_avx512f(auVar19,auVar17,2);
          if ((uVar4 & 1) != 0) {
            *(undefined1 *)(puVar6 + 0xf6) = 0;
          }
          if ((uVar4 & 2) != 0) {
            *(undefined1 *)(puVar6 + 0xfc) = 0;
          }
          if ((uVar4 & 4) != 0) {
            *(undefined1 *)(puVar6 + 0x102) = 0;
          }
          if ((uVar4 & 8) != 0) {
            *(undefined1 *)(puVar6 + 0x108) = 0;
          }
          if ((uVar4 & 0x10) != 0) {
            *(undefined1 *)(puVar6 + 0x10e) = 0;
          }
          if ((uVar4 & 0x20) != 0) {
            *(undefined1 *)(puVar6 + 0x114) = 0;
          }
          if ((uVar4 & 0x40) != 0) {
            *(undefined1 *)(puVar6 + 0x11a) = 0;
          }
          if ((uVar4 & 0x80) != 0) {
            *(undefined1 *)(puVar6 + 0x120) = 0;
          }
          auVar19 = vporq_avx512f(auVar18,auVar10);
          uVar4 = vpcmpuq_avx512f(auVar19,auVar17,2);
          if ((uVar4 & 1) != 0) {
            *(undefined1 *)(puVar6 + 0x126) = 0;
          }
          if ((uVar4 & 2) != 0) {
            *(undefined1 *)(puVar6 + 300) = 0;
          }
          if ((uVar4 & 4) != 0) {
            *(undefined1 *)(puVar6 + 0x132) = 0;
          }
          if ((uVar4 & 8) != 0) {
            *(undefined1 *)(puVar6 + 0x138) = 0;
          }
          if ((uVar4 & 0x10) != 0) {
            *(undefined1 *)(puVar6 + 0x13e) = 0;
          }
          if ((uVar4 & 0x20) != 0) {
            *(undefined1 *)(puVar6 + 0x144) = 0;
          }
          if ((uVar4 & 0x40) != 0) {
            *(undefined1 *)(puVar6 + 0x14a) = 0;
          }
          if ((uVar4 & 0x80) != 0) {
            *(undefined1 *)(puVar6 + 0x150) = 0;
          }
          auVar18 = vporq_avx512f(auVar18,auVar9);
          uVar4 = vpcmpuq_avx512f(auVar18,auVar17,2);
          if ((uVar4 & 1) != 0) {
            *(undefined1 *)(puVar6 + 0x156) = 0;
          }
          if ((uVar4 & 2) != 0) {
            *(undefined1 *)(puVar6 + 0x15c) = 0;
          }
          if ((uVar4 & 4) != 0) {
            *(undefined1 *)(puVar6 + 0x162) = 0;
          }
          if ((uVar4 & 8) != 0) {
            *(undefined1 *)(puVar6 + 0x168) = 0;
          }
          if ((uVar4 & 0x10) != 0) {
            *(undefined1 *)(puVar6 + 0x16e) = 0;
          }
          if ((uVar4 & 0x20) != 0) {
            *(undefined1 *)(puVar6 + 0x174) = 0;
          }
          if ((uVar4 & 0x40) != 0) {
            *(undefined1 *)(puVar6 + 0x17a) = 0;
          }
          if ((uVar4 & 0x80) != 0) {
            *(undefined1 *)(puVar6 + 0x180) = 0;
          }
          uVar7 = uVar7 + 0x40;
          puVar6 = puVar6 + 0x180;
        } while (((lVar8 - 0x30U) / 0x30 + 0x40 & 0xfffffffffffffc0) != uVar7);
      }
      this->m_values = (raw_node *)(puVar5 + 1);
      this->m_values_count = new_hash_size;
      this->m_num_valid = 0;
      this->m_hash_shift = (LZCOUNT(new_hash_size) ^ 0xffffffe0U) + 0x21;
      for (lVar8 = 0; (ulong)uVar2 * 0x30 - lVar8 != 0; lVar8 = lVar8 + 0x30) {
        if (prVar3->m_bits[lVar8 + 0x28] != '\0') {
          move_into(this,(node *)(prVar3->m_bits + lVar8));
          if (uVar1 == this->m_num_valid) break;
        }
      }
      this->m_grow_threshold = new_hash_size + 1 >> 1;
      if (prVar3 != (raw_node *)0x0) {
        operator_delete__(prVar3[-1].m_bits + 0x28);
        return;
      }
    }
  }
  return;
}

Assistant:

inline void rehash(unsigned new_hash_size)
    {
        TONK_DEBUG_ASSERT(new_hash_size >= m_num_valid);
        TONK_DEBUG_ASSERT((new_hash_size & (new_hash_size - 1)) == 0); // ispow2

        if ((new_hash_size < m_num_valid) ||
            (new_hash_size == m_values_count))
        {
            return;
        }

        raw_node* old_values = m_values;
        const unsigned old_values_count = m_values_count;
        const unsigned old_num_valid = m_num_valid;

        m_values = new raw_node[new_hash_size];
        m_values_count = new_hash_size;

        m_num_valid = 0;
        const unsigned bitIndex = NonzeroLowestBitIndex(new_hash_size);
        m_hash_shift = 32 - bitIndex;
        TONK_DEBUG_ASSERT(new_hash_size == (1U << (32 - m_hash_shift)));

        for (unsigned i = 0; i < old_values_count; ++i)
        {
            node* pNode = reinterpret_cast<node*>( old_values + i );

            if (pNode->state)
            {
                move_into(pNode);

                if (old_num_valid == m_num_valid) {
                    break;
                }
            }
        }

        m_grow_threshold = (new_hash_size + 1) >> 1;

        delete[] old_values;
    }